

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor-transfer-function.h
# Opt level: O2

vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_> *
__thiscall
wasm::analysis::
VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
::transfer(VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
           *this,BasicBlock *bb,Element *inputState)

{
  __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  __tmp;
  pointer ppEVar1;
  
  this->currState = inputState;
  for (ppEVar1 = (bb->insts).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      ppEVar1 !=
      (bb->insts).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start; ppEVar1 = ppEVar1 + -1) {
    Visitor<wasm::analysis::LivenessTransferFunction,_void>::visit
              ((Visitor<wasm::analysis::LivenessTransferFunction,_void> *)this,ppEVar1[-1]);
  }
  this->currState = (Element *)0x0;
  return &bb->predecessors;
}

Assistant:

const std::vector<const BasicBlock*>&
  transfer(const BasicBlock& bb, typename L::Element& inputState) noexcept {
    // If the block is empty, we propagate the state by inputState =
    // outputState.

    currState = &inputState;
    if constexpr (Direction == AnalysisDirection::Backward) {
      for (auto cfgIter = bb.rbegin(); cfgIter != bb.rend(); ++cfgIter) {
        static_cast<SubType*>(this)->visit(*cfgIter);
      }
    } else {
      for (auto* inst : bb) {
        static_cast<SubType*>(this)->visit(inst);
      }
    }
    currState = nullptr;

    if constexpr (Direction == AnalysisDirection::Backward) {
      return bb.preds();
    } else {
      return bb.succs();
    }
  }